

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crossings.cc
# Opt level: O0

bool S2::ApproximatelyOrdered(S2Point *a,S2Point *x,S2Point *b,double tolerance)

{
  S2Point *b_00;
  S2Point *a_00;
  double dVar1;
  double dVar2;
  Vector3_d local_90;
  D local_78;
  D local_60;
  D local_48;
  double local_30;
  double tolerance_local;
  S2Point *b_local;
  S2Point *x_local;
  S2Point *a_local;
  
  local_30 = tolerance;
  tolerance_local = (double)b;
  b_local = x;
  x_local = a;
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
            (&local_48,(BasicVector<Vector3,_double,_3UL> *)x,a);
  dVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                    ((BasicVector<Vector3,_double,_3UL> *)&local_48);
  if (local_30 * local_30 < dVar1) {
    util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
              (&local_60,(BasicVector<Vector3,_double,_3UL> *)b_local,(D *)tolerance_local);
    dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                      ((BasicVector<Vector3,_double,_3UL> *)&local_60);
    a_00 = x_local;
    b_00 = b_local;
    dVar1 = tolerance_local;
    if (local_30 * local_30 < dVar2) {
      RobustCrossProd(&local_90,x_local,(S2Point *)tolerance_local);
      util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
                (&local_78,(BasicVector<Vector3,_double,_3UL> *)&local_90);
      a_local._7_1_ = s2pred::OrderedCCW(a_00,b_00,(S2Point *)dVar1,&local_78);
    }
    else {
      a_local._7_1_ = true;
    }
  }
  else {
    a_local._7_1_ = true;
  }
  return a_local._7_1_;
}

Assistant:

static bool ApproximatelyOrdered(const S2Point& a, const S2Point& x,
                                 const S2Point& b, double tolerance) {
  if ((x - a).Norm2() <= tolerance * tolerance) return true;
  if ((x - b).Norm2() <= tolerance * tolerance) return true;
  return s2pred::OrderedCCW(a, x, b, S2::RobustCrossProd(a, b).Normalize());
}